

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool wallet::CWallet::AttachChain
               (shared_ptr<wallet::CWallet> *walletInstance,Chain *chain,bool rescan_required,
               bilingual_str *error,vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  _Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_> _Var1;
  CWallet *pCVar2;
  string original;
  pointer puVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  WalletDatabase *pWVar7;
  ulong uVar8;
  Chain *pCVar9;
  element_type *peVar10;
  int iVar11;
  int iVar12;
  long in_FS_OFFSET;
  undefined4 uStack_130;
  int rescan_height;
  undefined1 local_128 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock60;
  undefined1 local_108 [32];
  CBlockLocator locator;
  CBlockLocator locator_1;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  _Alloc_hider local_88;
  size_type sStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  uchar local_68 [16];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock60,
             &((walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->cs_wallet,"walletInstance->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0xca6,false);
  peVar10 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  pCVar9 = peVar10->m_chain;
  if (pCVar9 != chain && pCVar9 != (Chain *)0x0) {
    __assert_fail("!walletInstance->m_chain || walletInstance->m_chain == &chain",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                  ,0xca8,
                  "static bool wallet::CWallet::AttachChain(const std::shared_ptr<CWallet> &, interfaces::Chain &, const bool, bilingual_str &, std::vector<bilingual_str> &)"
                 );
  }
  peVar10->m_chain = chain;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&locator_1,"-walletcrosschain",(allocator<char> *)&locator);
  bVar4 = ArgsManager::GetBoolArg(&gArgs,(string *)&locator_1,false);
  std::__cxx11::string::~string((string *)&locator_1);
  if (bVar4) {
LAB_00151937:
    LOCK();
    (((walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    m_attaching_chain)._M_base._M_i = true;
    UNLOCK();
    pCVar9 = CWallet::chain((walletInstance->
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    std::__shared_ptr<interfaces::Chain::Notifications,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<wallet::CWallet,void>
              ((__shared_ptr<interfaces::Chain::Notifications,(__gnu_cxx::_Lock_policy)2> *)
               local_128,
               &walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*(long *)pCVar9 + 0x148))
              (&locator_1,pCVar9,
               (__shared_ptr<interfaces::Chain::Notifications,(__gnu_cxx::_Lock_policy)2> *)
               local_128);
    puVar3 = locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
    peVar10 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _Var1.super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl =
         (peVar10->m_chain_notifications_handler)._M_t.
         super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>._M_t.
         super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
         super__Head_base<0UL,_interfaces::Handler_*,_false>;
    (peVar10->m_chain_notifications_handler)._M_t.
    super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>._M_t.
    super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
    super__Head_base<0UL,_interfaces::Handler_*,_false> =
         (_Head_base<0UL,_interfaces::Handler_*,_false>)puVar3;
    if ((_Var1.super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl != (Handler *)0x0)
       && ((**(code **)(*(long *)_Var1.super__Head_base<0UL,_interfaces::Handler_*,_false>.
                                 _M_head_impl + 8))(),
          locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
      (**(code **)(*(long *)((locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start)->super_base_blob<256U>).
                            m_data._M_elems + 8))();
    }
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    rescan_height = 0;
    if (!rescan_required) {
      pWVar7 = GetDatabase((walletInstance->
                           super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      (*pWVar7->_vptr_WalletDatabase[0xe])(&locator,pWVar7,1);
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pWVar7;
      bVar4 = WalletBatch::ReadBestBlock((WalletBatch *)&locator,&locator_1);
      if ((bVar4) &&
         (uVar8 = (**(code **)(*(long *)chain + 0x38))(chain,&locator_1), (uVar8 & 0x100000000) != 0
         )) {
        rescan_height = (int)uVar8;
      }
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                ((_Vector_base<uint256,_std::allocator<uint256>_> *)&locator_1);
      if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_start)->super_base_blob<256U>).
                              m_data._M_elems + 0x28))();
      }
    }
    uVar8 = (**(code **)(*(long *)chain + 0x10))(chain);
    if ((uVar8 & 0x100000000) == 0) {
      base_blob<256U>::SetNull
                (&(((walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->m_last_block_processed).super_base_blob<256U>);
      peVar10 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      peVar10->m_last_block_processed_height = -1;
    }
    else {
      iVar12 = (int)uVar8;
      (**(code **)(*(long *)chain + 0x18))(&locator_1,chain,uVar8 & 0xffffffff);
      peVar10 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      *(undefined4 *)
       ((peVar10->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10) =
           locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_;
      *(undefined4 *)
       ((peVar10->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x14) =
           locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      *(undefined4 *)
       ((peVar10->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18) = uStack_90;
      *(undefined4 *)
       ((peVar10->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x1c) = uStack_8c;
      *(pointer *)(peVar10->m_last_block_processed).super_base_blob<256U>.m_data._M_elems =
           locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)((peVar10->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8) =
           locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
      peVar10 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      peVar10->m_last_block_processed_height = iVar12;
      if (rescan_height != iVar12) {
        local_68[0] = '\0';
        local_68[1] = '\0';
        local_68[2] = '\0';
        local_68[3] = '\0';
        local_68[4] = '\0';
        local_68[5] = '\0';
        local_68[6] = '\0';
        local_68[7] = '\0';
        local_68[8] = '\0';
        local_68[9] = '\0';
        local_68[10] = '\0';
        local_68[0xb] = '\0';
        local_68[0xc] = '\0';
        local_68[0xd] = '\0';
        local_68[0xe] = '\0';
        local_68[0xf] = '\0';
        local_78._M_allocated_capacity = 0;
        local_78._8_8_ = 0;
        local_88._M_p = (pointer)0x0;
        sStack_80 = 0;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&rescan_height;
        (**(code **)(*(long *)chain + 0x58))
                  (chain,(peVar10->m_birth_time).super___atomic_base<long>._M_i + -0x1c20,
                   rescan_height);
        if (local_68[8] == '\0') {
          rescan_height = iVar12;
        }
        cVar5 = (**(code **)(*(long *)chain + 0x108))(chain);
        if ((cVar5 != '\0') || (cVar5 = (**(code **)(*(long *)chain + 0x1a8))(chain), cVar5 != '\0')
           ) {
          uVar8 = uVar8 & 0xffffffff;
          do {
            iVar11 = (int)uVar8;
            local_108._0_4_ = iVar11;
            if (iVar11 < 1) break;
            uVar8 = (ulong)(iVar11 - 1U);
            bVar6 = (**(code **)(*(long *)chain + 0x20))(chain,iVar11 - 1U);
          } while ((bVar6 & iVar11 != rescan_height) != 0);
          if (rescan_height != iVar11) {
            cVar5 = (**(code **)(*(long *)chain + 0x108))(chain);
            if (cVar5 == '\0') {
              _((bilingual_str *)&locator,(ConstevalStringLiteral)0x3e56fc);
              tinyformat::format<int>
                        ((bilingual_str *)&locator_1,(bilingual_str *)&locator,(int *)local_108);
            }
            else {
              _((bilingual_str *)&locator_1,(ConstevalStringLiteral)0x3e566e);
            }
            bilingual_str::operator=(error,(bilingual_str *)&locator_1);
            bilingual_str::~bilingual_str((bilingual_str *)&locator_1);
            if (cVar5 == '\0') {
              bilingual_str::~bilingual_str((bilingual_str *)&locator);
            }
            goto LAB_00151cdb;
          }
        }
        _((bilingual_str *)&locator_1,(ConstevalStringLiteral)0x3e4671);
        (**(code **)(*(long *)chain + 0x128))(chain,&local_88);
        bilingual_str::~bilingual_str((bilingual_str *)&locator_1);
        WalletLogPrintf<int,int>
                  ((walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr,"Rescanning last %i blocks (from block %i)...\n",iVar12 - rescan_height,
                   rescan_height);
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(walletInstance->
                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar4 = WalletRescanReserver::reserve((WalletRescanReserver *)&locator,false);
        if (bVar4) {
          pCVar2 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
          (**(code **)(*(long *)chain + 0x18))(local_108,chain,rescan_height);
          ScanForWalletTransactions
                    ((ScanResult *)&locator_1,pCVar2,(uint256 *)local_108,rescan_height,
                     (optional<int>)0x0,(WalletRescanReserver *)&locator,true,true);
          if ((int)locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start == 0) {
            WalletRescanReserver::~WalletRescanReserver((WalletRescanReserver *)&locator);
            LOCK();
            (((walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->m_attaching_chain)._M_base._M_i = false;
            UNLOCK();
            pCVar2 = (walletInstance->
                     super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            (**(code **)(*(long *)chain + 0x28))(&locator_1);
            chainStateFlushed(pCVar2,NORMAL,&locator_1);
            std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                      ((_Vector_base<uint256,_std::allocator<uint256>_> *)&locator_1);
            pWVar7 = GetDatabase((walletInstance->
                                 super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr);
            (*pWVar7->_vptr_WalletDatabase[10])(pWVar7);
            peVar10 = (walletInstance->
                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            goto LAB_00151ab7;
          }
        }
        _((bilingual_str *)&locator_1,(ConstevalStringLiteral)0x3e583e);
        bilingual_str::operator=(error,(bilingual_str *)&locator_1);
        bilingual_str::~bilingual_str((bilingual_str *)&locator_1);
        WalletRescanReserver::~WalletRescanReserver((WalletRescanReserver *)&locator);
        goto LAB_00151cdb;
      }
    }
LAB_00151ab7:
    LOCK();
    (peVar10->m_attaching_chain)._M_base._M_i = false;
    UNLOCK();
    bVar4 = true;
  }
  else {
    pWVar7 = GetDatabase((walletInstance->
                         super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    (*pWVar7->_vptr_WalletDatabase[0xe])(local_108,pWVar7,1);
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108._8_8_ = pWVar7;
    bVar4 = WalletBatch::ReadBestBlock((WalletBatch *)local_108,&locator);
    if (((!bVar4) ||
        (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_start)) ||
       (uVar8 = (**(code **)(*(long *)chain + 0x10))(chain), (uVar8 & 0x100000000) == 0)) {
LAB_0015191d:
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                ((_Vector_base<uint256,_std::allocator<uint256>_> *)&locator);
      if ((long *)CONCAT44(local_108._4_4_,local_108._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_108._4_4_,local_108._0_4_) + 0x28))();
      }
      goto LAB_00151937;
    }
    (**(code **)(*(long *)chain + 0x18))(&locator_1,chain,0);
    bVar4 = operator!=((base_blob<256U> *)&locator_1,
                       &locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1].super_base_blob<256U>);
    if (!bVar4) goto LAB_0015191d;
    std::__cxx11::string::string<std::allocator<char>>
              (local_58,
               "Wallet files should not be reused across chains. Restart bitcoind with -walletcrosschain to override."
               ,(allocator<char> *)&rescan_height);
    original._M_string_length._0_4_ = uStack_130;
    original._M_dataplus._M_p = (pointer)error;
    original._M_string_length._4_4_ = rescan_height;
    original.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )local_128;
    Untranslated((bilingual_str *)&locator_1,original);
    bilingual_str::operator=(error,(bilingual_str *)&locator_1);
    bilingual_str::~bilingual_str((bilingual_str *)&locator_1);
    std::__cxx11::string::~string(local_58);
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
              ((_Vector_base<uint256,_std::allocator<uint256>_> *)&locator);
    if ((long *)CONCAT44(local_108._4_4_,local_108._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_108._4_4_,local_108._0_4_) + 0x28))();
    }
LAB_00151cdb:
    bVar4 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock60.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CWallet::AttachChain(const std::shared_ptr<CWallet>& walletInstance, interfaces::Chain& chain, const bool rescan_required, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    LOCK(walletInstance->cs_wallet);
    // allow setting the chain if it hasn't been set already but prevent changing it
    assert(!walletInstance->m_chain || walletInstance->m_chain == &chain);
    walletInstance->m_chain = &chain;

    // Unless allowed, ensure wallet files are not reused across chains:
    if (!gArgs.GetBoolArg("-walletcrosschain", DEFAULT_WALLETCROSSCHAIN)) {
        WalletBatch batch(walletInstance->GetDatabase());
        CBlockLocator locator;
        if (batch.ReadBestBlock(locator) && locator.vHave.size() > 0 && chain.getHeight()) {
            // Wallet is assumed to be from another chain, if genesis block in the active
            // chain differs from the genesis block known to the wallet.
            if (chain.getBlockHash(0) != locator.vHave.back()) {
                error = Untranslated("Wallet files should not be reused across chains. Restart bitcoind with -walletcrosschain to override.");
                return false;
            }
        }
    }

    // Register wallet with validationinterface. It's done before rescan to avoid
    // missing block connections between end of rescan and validation subscribing.
    // Because of wallet lock being hold, block connection notifications are going to
    // be pending on the validation-side until lock release. It's likely to have
    // block processing duplicata (if rescan block range overlaps with notification one)
    // but we guarantee at least than wallet state is correct after notifications delivery.
    // However, chainStateFlushed notifications are ignored until the rescan is finished
    // so that in case of a shutdown event, the rescan will be repeated at the next start.
    // This is temporary until rescan and notifications delivery are unified under same
    // interface.
    walletInstance->m_attaching_chain = true; //ignores chainStateFlushed notifications
    walletInstance->m_chain_notifications_handler = walletInstance->chain().handleNotifications(walletInstance);

    // If rescan_required = true, rescan_height remains equal to 0
    int rescan_height = 0;
    if (!rescan_required)
    {
        WalletBatch batch(walletInstance->GetDatabase());
        CBlockLocator locator;
        if (batch.ReadBestBlock(locator)) {
            if (const std::optional<int> fork_height = chain.findLocatorFork(locator)) {
                rescan_height = *fork_height;
            }
        }
    }

    const std::optional<int> tip_height = chain.getHeight();
    if (tip_height) {
        walletInstance->m_last_block_processed = chain.getBlockHash(*tip_height);
        walletInstance->m_last_block_processed_height = *tip_height;
    } else {
        walletInstance->m_last_block_processed.SetNull();
        walletInstance->m_last_block_processed_height = -1;
    }

    if (tip_height && *tip_height != rescan_height)
    {
        // No need to read and scan block if block was created before
        // our wallet birthday (as adjusted for block time variability)
        std::optional<int64_t> time_first_key = walletInstance->m_birth_time.load();
        if (time_first_key) {
            FoundBlock found = FoundBlock().height(rescan_height);
            chain.findFirstBlockWithTimeAndHeight(*time_first_key - TIMESTAMP_WINDOW, rescan_height, found);
            if (!found.found) {
                // We were unable to find a block that had a time more recent than our earliest timestamp
                // or a height higher than the wallet was synced to, indicating that the wallet is newer than the
                // current chain tip. Skip rescanning in this case.
                rescan_height = *tip_height;
            }
        }

        // Technically we could execute the code below in any case, but performing the
        // `while` loop below can make startup very slow, so only check blocks on disk
        // if necessary.
        if (chain.havePruned() || chain.hasAssumedValidChain()) {
            int block_height = *tip_height;
            while (block_height > 0 && chain.haveBlockOnDisk(block_height - 1) && rescan_height != block_height) {
                --block_height;
            }

            if (rescan_height != block_height) {
                // We can't rescan beyond blocks we don't have data for, stop and throw an error.
                // This might happen if a user uses an old wallet within a pruned node
                // or if they ran -disablewallet for a longer time, then decided to re-enable
                // Exit early and print an error.
                // It also may happen if an assumed-valid chain is in use and therefore not
                // all block data is available.
                // If a block is pruned after this check, we will load the wallet,
                // but fail the rescan with a generic error.

                error = chain.havePruned() ?
                     _("Prune: last wallet synchronisation goes beyond pruned data. You need to -reindex (download the whole blockchain again in case of pruned node)") :
                     strprintf(_(
                        "Error loading wallet. Wallet requires blocks to be downloaded, "
                        "and software does not currently support loading wallets while "
                        "blocks are being downloaded out of order when using assumeutxo "
                        "snapshots. Wallet should be able to load successfully after "
                        "node sync reaches height %s"), block_height);
                return false;
            }
        }

        chain.initMessage(_("Rescanning…").translated);
        walletInstance->WalletLogPrintf("Rescanning last %i blocks (from block %i)...\n", *tip_height - rescan_height, rescan_height);

        {
            WalletRescanReserver reserver(*walletInstance);
            if (!reserver.reserve() || (ScanResult::SUCCESS != walletInstance->ScanForWalletTransactions(chain.getBlockHash(rescan_height), rescan_height, /*max_height=*/{}, reserver, /*fUpdate=*/true, /*save_progress=*/true).status)) {
                error = _("Failed to rescan the wallet during initialization");
                return false;
            }
        }
        walletInstance->m_attaching_chain = false;
        walletInstance->chainStateFlushed(ChainstateRole::NORMAL, chain.getTipLocator());
        walletInstance->GetDatabase().IncrementUpdateCounter();
    }
    walletInstance->m_attaching_chain = false;

    return true;
}